

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

void __thiscall
wasm::WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::runOnFunction
          (WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *this,Module *module,
          Function *func)

{
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
    super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.currModule = module;
    (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
    super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.currFunction = func;
    wasm::ModuleUtils::ParallelFunctionAnalysis<std::unique_ptr<wasm::EffectAnalyzer,std::
    default_delete<wasm::EffectAnalyzer>>,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::
    ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,std::unique_ptr<wasm::
    EffectAnalyzer,std::default_delete<wasm::EffectAnalyzer>>&)>)::Mapper::doWalkFunction(wasm::
    Function__(this,func);
    (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
    super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.currFunction = (Function *)0x0;
    (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
    super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.currModule = (Module *)0x0;
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                ,0x214,
                "virtual void wasm::WalkerPass<wasm::PostWalker<Mapper>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<Mapper>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }